

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QImage * qvariant_cast<QImage>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImage *t;
  QMetaType targetType;
  QMetaType *in_stack_ffffffffffffffa8;
  QImage *image;
  QImage *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  image = in_RDI;
  QVar3 = QMetaType::fromType<QImage>();
  QVariant::Private::type((Private *)in_RDI);
  bVar2 = operator==((QMetaType *)in_RDI,in_stack_ffffffffffffffa8);
  if (bVar2) {
    QVariant::Private::get<QImage>((Private *)0x7c0971);
    QImage::QImage(in_stack_ffffffffffffffc0,image);
  }
  else {
    (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(in_RDI);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0x7c09cb);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar3.d_ptr,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return image;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}